

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RedirectedStream::RedirectedStream
          (RedirectedStream *this,ostream *originalStream,ostream *redirectionStream)

{
  long *plVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  lVar2 = std::ios::rdbuf();
  in_RDI[2] = lVar2;
  plVar1 = (long *)*in_RDI;
  lVar2 = *(long *)(*plVar1 + -0x18);
  std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)((long)plVar1 + lVar2));
  return;
}

Assistant:

RedirectedStream::RedirectedStream( std::ostream& originalStream, std::ostream& redirectionStream )
    :   m_originalStream( originalStream ),
        m_redirectionStream( redirectionStream ),
        m_prevBuf( m_originalStream.rdbuf() )
    {
        m_originalStream.rdbuf( m_redirectionStream.rdbuf() );
    }